

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void update_map(Integer **top,Integer **list,Integer **idx,Integer **jdx,void **data,Integer idim,
               Integer jdim,Integer elemsize,Integer *bufsize,Integer *ncnt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  long *in_RCX;
  long *in_RDX;
  long lVar9;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  Integer index;
  Integer jtmp;
  Integer itmp;
  Integer jj;
  Integer ii;
  char *optr;
  char *nptr;
  void *tdata;
  Integer newsize;
  Integer lcnt;
  Integer *tjdx;
  Integer *tidx;
  Integer *tlist;
  Integer *ttop;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_58;
  
  lVar1 = *(long *)itmp;
  lVar3 = lVar1 * 2;
  pvVar4 = malloc(lVar1 << 4);
  pvVar5 = malloc(lVar1 << 4);
  pvVar6 = malloc(lVar3 * jtmp);
  local_58 = 0;
  for (local_80 = 0; local_80 < lVar3; local_80 = local_80 + 1) {
    *(undefined8 *)((long)pvVar5 + local_80 * 8) = 0xffffffffffffffff;
  }
  pvVar7 = malloc(lVar1 << 4);
  pvVar8 = malloc(lVar1 << 4);
  for (local_80 = 0; local_80 < *(long *)itmp; local_80 = local_80 + 1) {
    for (local_88 = *(long *)(*in_RDI + local_80 * 8); -1 < local_88;
        local_88 = *(long *)(*in_RSI + local_88 * 8)) {
      lVar1 = *(long *)(*in_RDX + local_88 * 8);
      lVar2 = *(long *)(*in_RCX + local_88 * 8);
      lVar9 = (index * lVar1 + lVar2) % lVar3;
      *(undefined8 *)((long)pvVar5 + local_58 * 8) = *(undefined8 *)((long)pvVar4 + lVar9 * 8);
      *(long *)((long)pvVar4 + lVar9 * 8) = local_58;
      *(long *)((long)pvVar7 + local_58 * 8) = lVar1;
      *(long *)((long)pvVar8 + local_58 * 8) = lVar2;
      memcpy((void *)((long)pvVar6 + local_58 * jtmp),(void *)(*in_R8 + local_88 * jtmp),jtmp);
      local_58 = local_58 + 1;
    }
  }
  free((void *)*in_RDI);
  free((void *)*in_RSI);
  free((void *)*in_RDX);
  free((void *)*in_RCX);
  free((void *)*in_R8);
  *(long *)itmp = lVar3;
  *in_RDI = (long)pvVar4;
  *in_RSI = (long)pvVar5;
  *in_RDX = (long)pvVar7;
  *in_RCX = (long)pvVar8;
  *in_R8 = (long)pvVar6;
  *(long *)jj = local_58;
  return;
}

Assistant:

void update_map(Integer **top, Integer **list, Integer **idx, Integer **jdx,
    void **data, Integer idim, Integer jdim, Integer elemsize,
    Integer *bufsize, Integer *ncnt)
{
  Integer *ttop;
  Integer *tlist;
  Integer *tidx, *tjdx;
  Integer lcnt;
  Integer newsize;
  void *tdata;
  char *nptr;
  char *optr;
  Integer ii,jj;
  newsize = 2*(*bufsize);
  ttop = (Integer*)malloc(newsize*sizeof(Integer));
  tlist = (Integer*)malloc(newsize*sizeof(Integer));
  tdata = malloc(newsize*elemsize);
  lcnt = 0;
  for (ii=0; ii<newsize; ii++) tlist[ii] = -1;
  tidx = (Integer*)malloc(newsize*sizeof(Integer));
  tjdx = (Integer*)malloc(newsize*sizeof(Integer));
  for (ii=0; ii<*bufsize; ii++) {
    jj = (*top)[ii];
    while (jj >= 0) {
      Integer itmp = (*idx)[jj];
      Integer jtmp = (*jdx)[jj];
      Integer index = (jdim*itmp + jtmp)%newsize;
      tlist[lcnt] = ttop[index];
      ttop[index] = lcnt;
      tidx[lcnt] = itmp; 
      tjdx[lcnt] = jtmp; 
      nptr = (char*)tdata + lcnt*elemsize;
      optr = (char*)(*data) + jj*elemsize;
      memcpy(nptr,optr,elemsize);
      jj = (*list)[jj];
      lcnt++;
    }
  }
  free(*top);
  free(*list);
  free(*idx);
  free(*jdx);
  free(*data);
  *bufsize = newsize;
  *top = ttop;
  *list = tlist;
  *idx = tidx;
  *jdx = tjdx;
  *data = tdata;
  *ncnt = lcnt;
}